

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O1

void rw::d3d8::writeNativeTexture(Texture *tex,Stream *stream)

{
  Raster *this;
  uint8 val;
  uint32 uVar1;
  int32 iVar2;
  uint uVar3;
  uint8 *puVar4;
  undefined8 uVar5;
  int iVar6;
  long lVar7;
  
  uVar1 = getSizeNativeTexture(tex);
  writeChunkHeader(stream,1,uVar1 - 0xc);
  Stream::writeU32(stream,8);
  Stream::writeU32(stream,tex->filterAddressing);
  (*stream->_vptr_Stream[3])(stream,tex->name,0x20);
  (*stream->_vptr_Stream[3])(stream,tex->mask,0x20);
  this = tex->raster;
  lVar7 = (long)d3d::nativeRasterOffset;
  iVar2 = Raster::getNumLevels(this);
  Stream::writeI32(stream,this->format);
  Stream::writeI32(stream,(uint)*(byte *)((long)&this->stride + lVar7));
  Stream::writeU16(stream,(uint16)this->width);
  Stream::writeU16(stream,(uint16)this->height);
  Stream::writeU8(stream,(uint8)this->depth);
  Stream::writeU8(stream,(uint8)iVar2);
  Stream::writeU8(stream,(uint8)this->type);
  iVar6 = *(int *)((long)&this->height + lVar7);
  if ((iVar6 == 0) || (uVar3 = iVar6 + 0xceaba7bc, 4 < (uVar3 * 0x100 | uVar3 >> 0x18))) {
    val = '\0';
  }
  else {
    val = (char)(uVar3 >> 0x18) + '\x01';
  }
  Stream::writeU8(stream,val);
  uVar5 = 0x80;
  if ((((uint)this->format >> 0xe & 1) != 0) ||
     (uVar5 = 0x400, ((uint)this->format >> 0xd & 1) != 0)) {
    (*stream->_vptr_Stream[3])(stream,*(undefined8 *)((long)&this->flags + lVar7),uVar5);
  }
  if (0 < iVar2) {
    iVar6 = 0;
    do {
      uVar3 = d3d::getLevelSize(this,iVar6);
      Stream::writeU32(stream,uVar3);
      puVar4 = Raster::lock(this,iVar6,2);
      (*stream->_vptr_Stream[3])(stream,puVar4,(ulong)uVar3);
      Raster::unlock(this,iVar6);
      iVar6 = iVar6 + 1;
    } while (iVar2 != iVar6);
  }
  return;
}

Assistant:

void
writeNativeTexture(Texture *tex, Stream *stream)
{
	int32 chunksize = getSizeNativeTexture(tex);
	writeChunkHeader(stream, ID_STRUCT, chunksize-12);
	stream->writeU32(PLATFORM_D3D8);

	// Texture
	stream->writeU32(tex->filterAddressing);
	stream->write8(tex->name, 32);
	stream->write8(tex->mask, 32);

	// Raster
	Raster *raster = tex->raster;
	D3dRaster *ras = GETD3DRASTEREXT(raster);
	int32 numLevels = raster->getNumLevels();
	stream->writeI32(raster->format);
	stream->writeI32(ras->hasAlpha);
	stream->writeU16(raster->width);
	stream->writeU16(raster->height);
	stream->writeU8(raster->depth);
	stream->writeU8(numLevels);
	stream->writeU8(raster->type);
	int32 compression = 0;
	if(ras->format)
		switch(ras->format){
		case 0x31545844:	// DXT1
			compression = 1;
			break;
		case 0x32545844:	// DXT2
			compression = 2;
			break;
		case 0x33545844:	// DXT3
			compression = 3;
			break;
		case 0x34545844:	// DXT4
			compression = 4;
			break;
		case 0x35545844:	// DXT5
			compression = 5;
			break;
		}
	stream->writeU8(compression);

	if(raster->format & Raster::PAL4)
		stream->write8(ras->palette, 4*32);
	else if(raster->format & Raster::PAL8)
		stream->write8(ras->palette, 4*256);

	uint32 size;
	uint8 *data;
	for(int32 i = 0; i < numLevels; i++){
		size = getLevelSize(raster, i);
		stream->writeU32(size);
		data = raster->lock(i, Raster::LOCKREAD);
		stream->write8(data, size);
		raster->unlock(i);
	}
}